

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffimem(fitsfile **fptr,void **buffptr,size_t *buffsize,size_t deltasize,
          _func_void_ptr_void_ptr_size_t *mem_realloc,int *status)

{
  size_t sVar1;
  int iVar2;
  fitsfile *fptr_00;
  FITSfile *pFVar3;
  LONGLONG *pLVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  int handle;
  int driver;
  char urltype [20];
  
  if (0 < *status) {
    return *status;
  }
  *fptr = (fitsfile *)0x0;
  if (need_to_initialize != 0) {
    iVar2 = fits_init_cfitsio();
    *status = iVar2;
    if (0 < iVar2) {
      return iVar2;
    }
  }
  builtin_strncpy(urltype,"memkeep://",0xb);
  iVar2 = urltype2driver(urltype,&driver);
  *status = iVar2;
  if (iVar2 == 0) {
    iVar2 = mem_openmem(buffptr,buffsize,deltasize,mem_realloc,&handle);
    *status = iVar2;
    if (iVar2 < 1) {
      fptr_00 = (fitsfile *)calloc(1,0x10);
      *fptr = fptr_00;
      if (fptr_00 == (fitsfile *)0x0) {
        (*driverTable[driver].close)(handle);
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
      }
      else {
        pFVar3 = (FITSfile *)calloc(1,0x7e8);
        fptr_00->Fptr = pFVar3;
        if (pFVar3 == (FITSfile *)0x0) {
          (*driverTable[driver].close)(handle);
          ffpmsg("failed to allocate structure for memory file: (ffimem)");
        }
        else {
          pcVar7 = (char *)malloc(0x20);
          pFVar3->filename = pcVar7;
          if (pcVar7 == (char *)0x0) {
            (*driverTable[driver].close)(handle);
            ffpmsg("failed to allocate memory for filename: (ffimem)");
          }
          else {
            pLVar4 = (LONGLONG *)calloc(0x3e9,8);
            pFVar3->headstart = pLVar4;
            if (pLVar4 == (LONGLONG *)0x0) {
              (*driverTable[driver].close)(handle);
              ffpmsg("failed to allocate memory for headstart array: (ffimem)");
            }
            else {
              pcVar5 = (char *)calloc(0x28,0xb40);
              pFVar3->iobuffer = pcVar5;
              if (pcVar5 != (char *)0x0) {
                for (lVar6 = 0x1d2; lVar6 != 0x1fa; lVar6 = lVar6 + 1) {
                  (&pFVar3->filehandle)[lVar6] = (int)lVar6 + -0x1d2;
                  *(undefined8 *)((long)pFVar3 + lVar6 * 8 + -0x928) = 0xffffffffffffffff;
                }
                pFVar3->MAXHDU = 1000;
                pFVar3->filehandle = handle;
                pFVar3->driver = driver;
                builtin_strncpy(pcVar7,"memfile",8);
                sVar1 = *buffsize;
                pFVar3->filesize = sVar1;
                pFVar3->logfilesize = sVar1;
                pFVar3->writemode = 1;
                pFVar3->datastart = -1;
                pFVar3->curbuf = -1;
                pFVar3->open_count = 1;
                pFVar3->validcode = 0x22b;
                pFVar3->noextsyntax = 0;
                ffldrc(fptr_00,0,1,status);
                fits_store_Fptr((*fptr)->Fptr,status);
                goto LAB_0011a9d1;
              }
              (*driverTable[driver].close)(handle);
              ffpmsg("failed to allocate memory for iobuffer array: (ffimem)");
              free((*fptr)->Fptr->headstart);
            }
            free((*fptr)->Fptr->filename);
          }
          free((*fptr)->Fptr);
        }
        free(*fptr);
        *fptr = (fitsfile *)0x0;
      }
      *status = 0x71;
      return 0x71;
    }
    pcVar7 = "failed to open pre-existing memory file: (ffimem)";
  }
  else {
    pcVar7 = "could not find driver for pre-existing memory file: (ffimem)";
  }
  ffpmsg(pcVar7);
LAB_0011a9d1:
  return *status;
}

Assistant:

int ffimem(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           void **buffptr,       /* I - address of memory pointer           */
           size_t *buffsize,     /* I - size of buffer, in bytes            */
           size_t deltasize,     /* I - increment for future realloc's      */
           void *(*mem_realloc)(void *p, size_t newsize), /* function       */
           int *status)          /* IO - error status                       */

/*
  Create and initialize a new FITS file in memory
*/
{
    int ii, driver, slen;
    char urltype[MAX_PREFIX_LEN];
    int handle;

    if (*status > 0)
        return(*status);

    *fptr = 0;              /* initialize null file pointer */

    if (need_to_initialize)    {        /* this is called only once */
       *status = fits_init_cfitsio();
    }
    
    if (*status > 0)
        return(*status);

    strcpy(urltype, "memkeep://"); /* URL type for pre-existing memory file */

    *status = urltype2driver(urltype, &driver);

    if (*status > 0)
    {
        ffpmsg("could not find driver for pre-existing memory file: (ffimem)");
        return(*status);
    }

    /* call driver routine to "open" the memory file */
    FFLOCK;  /* lock this while searching for vacant handle */
    *status =   mem_openmem( buffptr, buffsize, deltasize,
                            mem_realloc,  &handle);
    FFUNLOCK;

    if (*status > 0)
    {
         ffpmsg("failed to open pre-existing memory file: (ffimem)");
         return(*status);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = 32; /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffimem)");
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffimem)");
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffimem)");
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* file handle */
    ((*fptr)->Fptr)->driver = driver;            /* driver number */
    strcpy(((*fptr)->Fptr)->filename, "memfile"); /* dummy filename */
    ((*fptr)->Fptr)->filesize = *buffsize;        /* physical file size */
    ((*fptr)->Fptr)->logfilesize = *buffsize;     /* logical file size */
    ((*fptr)->Fptr)->writemode = 1;               /* read-write mode    */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED;  /* unknown start of data */
    ((*fptr)->Fptr)->curbuf = -1;             /* undefined current IO buffer */
    ((*fptr)->Fptr)->open_count = 1;     /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = 0;  /* extended syntax can be used in filename */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */
    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */
    return(*status); 
}